

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

int SubsetCountNodesAux(DdNode *node,st__table *table,double max)

{
  int *piVar1;
  double **ppdVar2;
  int iVar3;
  int iVar4;
  DdNode *node_00;
  long lVar5;
  ulong uVar6;
  NodeData_t **__ptr;
  int iVar7;
  int *piVar8;
  DdNode *node_01;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  NodeData_t *dummyNBar;
  NodeData_t *dummyN;
  NodeData_t *dummyNnv;
  NodeData_t *dummyNv;
  char *local_58;
  char *local_50;
  double local_48;
  char *local_40;
  char *local_38;
  
  if (node == (DdNode *)0x0) {
    return 0;
  }
  piVar8 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar8 == 0x7fffffff) {
    return 0;
  }
  iVar3 = st__lookup(table,(char *)node,&local_50);
  if (iVar3 != 1) {
    return 0;
  }
  if (*(long *)(local_50 + 8) != 0) {
    return 0;
  }
  uVar6 = *(ulong *)(piVar8 + 6);
  uVar10 = (ulong)((uint)node & 1);
  node_00 = (DdNode *)(uVar10 ^ *(ulong *)(piVar8 + 4));
  if (*(int *)(*(ulong *)(piVar8 + 4) & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar12 = 0.0;
    if (zero != node_00) {
      dVar12 = max;
    }
  }
  else {
    iVar3 = st__lookup(table,(char *)node_00,&local_38);
    if (iVar3 != 1) {
      return 0;
    }
    dVar12 = **(double **)local_38;
  }
  node_01 = (DdNode *)(uVar10 ^ uVar6);
  if (*(int *)(uVar6 & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar11 = 0.0;
    if (zero != node_01) {
      dVar11 = max;
    }
  }
  else {
    local_48 = dVar12;
    iVar3 = st__lookup(table,(char *)node_01,&local_40);
    if (iVar3 != 1) {
      return 0;
    }
    dVar11 = **(double **)local_40;
    dVar12 = local_48;
  }
  if (dVar11 <= dVar12) {
    iVar3 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar4 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar7 = iVar4;
    if ((pageIndex == 0x800) && (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut != '\0')) {
      lVar9 = (long)page;
      for (lVar5 = 0; lVar5 <= lVar9; lVar5 = lVar5 + 1) {
        if (ppdVar2[lVar5] != (double *)0x0) {
          free(ppdVar2[lVar5]);
          ppdVar2[lVar5] = (double *)0x0;
        }
      }
      if (ppdVar2 != (double **)0x0) {
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      lVar9 = (long)nodeDataPage;
      for (lVar5 = 0; lVar5 <= lVar9; lVar5 = lVar5 + 1) {
        if (__ptr[lVar5] != (NodeData_t *)0x0) {
          free(__ptr[lVar5]);
          __ptr[lVar5] = (NodeData_t *)0x0;
        }
      }
      goto LAB_0062989f;
    }
  }
  else {
    iVar4 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar3 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar7 = iVar3;
    if ((pageIndex == 0x800) && (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut != '\0')) {
      lVar9 = (long)page;
      for (lVar5 = 0; lVar5 <= lVar9; lVar5 = lVar5 + 1) {
        if (ppdVar2[lVar5] != (double *)0x0) {
          free(ppdVar2[lVar5]);
          ppdVar2[lVar5] = (double *)0x0;
        }
      }
      if (ppdVar2 != (double **)0x0) {
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      lVar9 = (long)nodeDataPage;
      for (lVar5 = 0; lVar5 <= lVar9; lVar5 = lVar5 + 1) {
        if (__ptr[lVar5] != (NodeData_t *)0x0) {
          free(__ptr[lVar5]);
          __ptr[lVar5] = (NodeData_t *)0x0;
        }
      }
      goto LAB_0062989f;
    }
  }
  piVar8 = currentLightNodePage + pageIndex;
  *piVar8 = iVar7;
  *(int **)(local_50 + 0x10) = piVar8;
  piVar8 = currentNodePage + pageIndex;
  *piVar8 = iVar3 + iVar4 + 1;
  *(int **)(local_50 + 8) = piVar8;
  pageIndex = pageIndex + 1;
  iVar3 = st__lookup(table,(char *)((ulong)node ^ 1),&local_58);
  if (iVar3 == 1) {
    if (pageIndex == 0x800) {
      ResizeCountNodePages();
    }
    ppdVar2 = mintermPages;
    if (memOut == '\x01') {
      uVar6 = 0;
      uVar10 = (ulong)(uint)page;
      if (page < 1) {
        uVar10 = 0;
      }
      for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        if (ppdVar2[uVar6] != (double *)0x0) {
          free(ppdVar2[uVar6]);
          ppdVar2[uVar6] = (double *)0x0;
        }
      }
      if (ppdVar2 != (double **)0x0) {
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      uVar10 = 0;
      uVar6 = (ulong)(uint)nodeDataPage;
      if (nodeDataPage < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (__ptr[uVar10] != (NodeData_t *)0x0) {
          free(__ptr[uVar10]);
          __ptr[uVar10] = (NodeData_t *)0x0;
        }
      }
    }
    else {
      lVar5 = (long)pageIndex;
      piVar1 = currentLightNodePage + lVar5;
      *piVar1 = 0;
      *(int **)(local_58 + 0x10) = piVar1;
      if ((lVar5 != 0x800) || (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut != '\x01')) {
        piVar1 = currentNodePage + pageIndex;
        *piVar1 = 0;
        *(int **)(local_58 + 8) = piVar1;
        pageIndex = pageIndex + 1;
        goto LAB_0062980a;
      }
      uVar6 = 0;
      uVar10 = (ulong)(uint)page;
      if (page < 1) {
        uVar10 = 0;
      }
      for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        if (ppdVar2[uVar6] != (double *)0x0) {
          free(ppdVar2[uVar6]);
          ppdVar2[uVar6] = (double *)0x0;
        }
      }
      if (ppdVar2 != (double **)0x0) {
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      uVar10 = 0;
      uVar6 = (ulong)(uint)nodeDataPage;
      if (nodeDataPage < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (__ptr[uVar10] != (NodeData_t *)0x0) {
          free(__ptr[uVar10]);
          __ptr[uVar10] = (NodeData_t *)0x0;
        }
      }
    }
LAB_0062989f:
    if (__ptr != (NodeData_t **)0x0) {
      free(__ptr);
      nodeDataPages = (NodeData_t **)0x0;
    }
    st__free_table(table);
    return 0;
  }
LAB_0062980a:
  return *piVar8;
}

Assistant:

static int
SubsetCountNodesAux(
  DdNode * node /* current node */,
  st__table * table /* table to update node count, also serves as visited table. */,
  double  max /* maximum number of variables */)
{
    int tval, eval, i;
    DdNode *N, *Nv, *Nnv;
    double minNv, minNnv;
    NodeData_t *dummyN, *dummyNv, *dummyNnv, *dummyNBar;
    int *pmin, *pminBar, *val;

    if ((node == NULL) || Cudd_IsConstant(node))
        return(0);

    /* if this node has been processed do nothing */
    if ( st__lookup(table, (const char *)node, (char **)&dummyN) == 1) {
        val = dummyN->nodesPointer;
        if (val != NULL)
            return(0);
    } else {
        return(0);
    }

    N  = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* find the minterm counts for the THEN and ELSE branches */
    if (Cudd_IsConstant(Nv)) {
        if (Nv == zero) {
            minNv = 0.0;
        } else {
            minNv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nv, (char **)&dummyNv) == 1)
            minNv = *(dummyNv->mintermPointer);
        else {
            return(0);
        }
    }
    if (Cudd_IsConstant(Nnv)) {
        if (Nnv == zero) {
            minNnv = 0.0;
        } else {
            minNnv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nnv, (char **)&dummyNnv) == 1) {
            minNnv = *(dummyNnv->mintermPointer);
        }
        else {
            return(0);
        }
    }


    /* recur based on which has larger minterm, */
    if (minNv >= minNnv) {
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = eval; /* Here the ELSE child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    } else {
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = tval; /* Here the THEN child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    }
    /* updating the page index for node count storage. */
    pmin = currentNodePage + pageIndex;
    *pmin = tval + eval + 1;
    dummyN->nodesPointer = pmin;

    /* pageIndex is parallel page index for count_nodes and count_lightNodes */
    pageIndex++;

    /* if this node has been reached first, it belongs to a heavier
       branch. Its complement will be reached later on a lighter branch.
       Hence the complement has zero node count. */

    if ( st__lookup(table, (const char *)Cudd_Not(node), (char **)&dummyNBar) == 1)  {
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentLightNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->lightChildNodesPointer = pminBar;
        /* The lighter child has less nodes than the parent.
         * So if parent 0 then lighter child zero
         */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->nodesPointer = pminBar ; /* maybe should point to zero */

        pageIndex++;
    }
    return(*pmin);
}